

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IGeneratorInfo * __thiscall
Catch::GeneratorsForTest::getGeneratorInfo(GeneratorsForTest *this,string *fileInfo,size_t size)

{
  pointer *pppIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator __position;
  iterator iVar4;
  IGeneratorInfo *pIVar5;
  IGeneratorInfo *info;
  IGeneratorInfo *local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>
  local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
          ::find(&(this->m_generatorsByName)._M_t,fileInfo);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->m_generatorsByName)._M_t._M_impl.super__Rb_tree_header) {
    pIVar5 = (IGeneratorInfo *)operator_new(0x18);
    pIVar5->_vptr_IGeneratorInfo = (_func_int **)&PTR__IGeneratorInfo_00172290;
    pIVar5[1]._vptr_IGeneratorInfo = (_func_int **)size;
    pIVar5[2]._vptr_IGeneratorInfo = (_func_int **)0x0;
    paVar2 = &local_50.first.field_2;
    pcVar3 = (fileInfo->_M_dataplus)._M_p;
    local_58 = pIVar5;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + fileInfo->_M_string_length);
    local_50.second = pIVar5;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IGeneratorInfo*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorInfo*>>>
                *)&this->m_generatorsByName,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    __position._M_current =
         (this->m_generatorsInOrder).
         super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_generatorsInOrder).
        super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>::
      _M_realloc_insert<Catch::IGeneratorInfo*const&>
                ((vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>> *)
                 &this->m_generatorsInOrder,__position,&local_58);
    }
    else {
      *__position._M_current = pIVar5;
      pppIVar1 = &(this->m_generatorsInOrder).
                  super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
      local_58 = pIVar5;
    }
  }
  else {
    local_58 = *(IGeneratorInfo **)(iVar4._M_node + 2);
  }
  return local_58;
}

Assistant:

IGeneratorInfo& getGeneratorInfo( std::string const& fileInfo, std::size_t size ) {
            std::map<std::string, IGeneratorInfo*>::const_iterator it = m_generatorsByName.find( fileInfo );
            if( it == m_generatorsByName.end() ) {
                IGeneratorInfo* info = new GeneratorInfo( size );
                m_generatorsByName.insert( std::make_pair( fileInfo, info ) );
                m_generatorsInOrder.push_back( info );
                return *info;
            }
            return *it->second;
        }